

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kd_tree_custom_search_visitor.cpp
# Opt level: O2

int main(void)

{
  ostream *poVar1;
  size_t in_RDX;
  search_nn_counter<pico_tree::neighbor<int,_float>_> v;
  max_leaf_size_t max_leaf_size;
  neighbor nn;
  kd_tree tree;
  undefined8 local_c0;
  int local_b8 [2];
  undefined1 *local_b0;
  _Vector_base<pico_tree::point<float,_2UL>,_std::allocator<pico_tree::point<float,_2UL>_>_>
  local_a8;
  undefined8 local_90;
  undefined1 local_88 [4];
  undefined4 local_84;
  kd_tree<std::vector<pico_tree::point<float,_2UL>,_std::allocator<pico_tree::point<float,_2UL>_>_>,_pico_tree::metric_l2_squared,_int>
  local_80;
  
  local_90 = 0xc;
  pico_tree::generate_random_n<pico_tree::point<float,2ul>>
            ((vector<pico_tree::point<float,_2UL>,_std::allocator<pico_tree::point<float,_2UL>_>_> *
             )&local_a8,(pico_tree *)&Elf64_Ehdr_00100000,in_RDX,1000.0);
  pico_tree::
  kd_tree<std::vector<pico_tree::point<float,2ul>,std::allocator<pico_tree::point<float,2ul>>>,pico_tree::metric_l2_squared,int>
  ::
  kd_tree<pico_tree::max_leaf_size_t,pico_tree::bounds_from_space_t,pico_tree::sliding_midpoint_max_side_t>
            ((kd_tree<std::vector<pico_tree::point<float,2ul>,std::allocator<pico_tree::point<float,2ul>>>,pico_tree::metric_l2_squared,int>
              *)&local_80,(space_type *)&local_a8,
             (splitter_stop_condition_t<pico_tree::max_leaf_size_t> *)&local_90,
             (splitter_start_bounds_t<pico_tree::bounds_from_space_t> *)local_b8,
             (splitter_rule_t<pico_tree::sliding_midpoint_max_side_t> *)&local_c0);
  std::_Vector_base<pico_tree::point<float,_2UL>,_std::allocator<pico_tree::point<float,_2UL>_>_>::
  ~_Vector_base(&local_a8);
  local_b8[0] = 0;
  local_c0 = 0x43fa000043fa0000;
  local_b0 = local_88;
  local_84 = 0x7f7fffff;
  pico_tree::
  kd_tree<std::vector<pico_tree::point<float,2ul>,std::allocator<pico_tree::point<float,2ul>>>,pico_tree::metric_l2_squared,int>
  ::
  search_nearest<pico_tree::internal::point_wrapper<pico_tree::point<float,2ul>>,search_nn_counter<pico_tree::neighbor<int,float>>>
            ((kd_tree<std::vector<pico_tree::point<float,2ul>,std::allocator<pico_tree::point<float,2ul>>>,pico_tree::metric_l2_squared,int>
              *)&local_80);
  poVar1 = std::operator<<((ostream *)&std::cout,"Number of points visited: ");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,local_b8[0]);
  std::endl<char,std::char_traits<char>>(poVar1);
  pico_tree::
  kd_tree<std::vector<pico_tree::point<float,_2UL>,_std::allocator<pico_tree::point<float,_2UL>_>_>,_pico_tree::metric_l2_squared,_int>
  ::~kd_tree(&local_80);
  return 0;
}

Assistant:

int main() {
  using point = pico_tree::point_2f;
  using scalar = typename point::scalar_type;

  pico_tree::max_leaf_size_t max_leaf_size = 12;
  std::size_t point_count = 1024 * 1024;
  scalar area_size = 1000;

  using kd_tree = pico_tree::kd_tree<std::vector<point>>;
  using neighbor = typename kd_tree::neighbor_type;

  kd_tree tree(
      pico_tree::generate_random_n<point>(point_count, area_size),
      max_leaf_size);

  point q{area_size / scalar(2.0), area_size / scalar(2.0)};
  neighbor nn;
  search_nn_counter<neighbor> v(nn);
  tree.search_nearest(q, v);

  std::cout << "Number of points visited: " << v.count() << std::endl;

  return 0;
}